

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O1

int dlep_reader_ipv4_subnet_tlv
              (netaddr *ipv4,_Bool *add,dlep_session *session,dlep_parser_value *value)

{
  byte *pbVar1;
  int iVar2;
  
  if (value == (dlep_parser_value *)0x0) {
    value = dlep_session_get_tlv_value(session,10);
    if (value == (dlep_parser_value *)0x0) {
      return -1;
    }
  }
  pbVar1 = (session->parser).tlv_ptr + value->index;
  *add = (_Bool)(*pbVar1 & 1);
  iVar2 = netaddr_from_binary_prefix(ipv4,pbVar1 + 1,4,'\x02',pbVar1[5]);
  return iVar2;
}

Assistant:

int
dlep_reader_ipv4_subnet_tlv(
  struct netaddr *ipv4, bool *add, struct dlep_session *session, struct dlep_parser_value *value) {
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_IPV4_SUBNET_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  *add = (ptr[0] & DLEP_IP_ADD) == DLEP_IP_ADD;
  return netaddr_from_binary_prefix(ipv4, &ptr[1], 4, AF_INET, ptr[5]);
}